

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O0

void __thiscall
TestRegenerateCmakeTargetLinkLibraries_Interface::Run
          (TestRegenerateCmakeTargetLinkLibraries_Interface *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  byte bVar1;
  runtime_error *this_00;
  __type v;
  ostringstream oss;
  string expectedOutput;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  privateDeps;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  publicDeps;
  bool isHeaderOnly;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc4f;
  allocator_type *in_stack_fffffffffffffc50;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc58;
  ostream *in_stack_fffffffffffffc60;
  undefined7 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6f;
  size_type in_stack_fffffffffffffc70;
  allocator *paVar2;
  string *local_378;
  string *local_338;
  string local_308 [39];
  byte local_2e1;
  ostringstream local_2e0 [383];
  allocator local_161;
  string local_160 [37];
  undefined1 local_13b;
  allocator local_13a;
  allocator local_139;
  string *local_138;
  string local_130 [32];
  string local_110 [32];
  string *local_f0;
  undefined8 local_e8;
  undefined1 local_ae;
  allocator local_ad [20];
  allocator local_99;
  string *local_98;
  string local_90 [32];
  string local_70 [32];
  string *local_50;
  undefined8 local_48;
  undefined1 local_9;
  
  local_9 = 1;
  local_ae = 1;
  local_98 = local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"ComponentA",&local_99);
  local_98 = local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"ComponentB",local_ad);
  local_ae = 0;
  local_50 = local_90;
  local_48 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x15721e);
  __l._M_array._7_1_ = in_stack_fffffffffffffc6f;
  __l._M_array._0_7_ = in_stack_fffffffffffffc68;
  __l._M_len = in_stack_fffffffffffffc70;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)in_stack_fffffffffffffc60,__l,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x15725a);
  local_338 = (string *)&local_50;
  do {
    local_338 = local_338 + -0x20;
    std::__cxx11::string::~string(local_338);
  } while (local_338 != local_90);
  std::allocator<char>::~allocator((allocator<char> *)local_ad);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  local_13b = 1;
  local_138 = local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"ComponentZ",&local_139);
  local_138 = local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"ComponentY",&local_13a);
  local_13b = 0;
  local_f0 = local_130;
  local_e8 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x15739d);
  __l_00._M_array._7_1_ = in_stack_fffffffffffffc6f;
  __l_00._M_array._0_7_ = in_stack_fffffffffffffc68;
  __l_00._M_len = in_stack_fffffffffffffc70;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)in_stack_fffffffffffffc60,__l_00,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1573d9);
  local_378 = (string *)&local_f0;
  do {
    local_378 = local_378 + -0x20;
    std::__cxx11::string::~string(local_378);
  } while (local_378 != local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_13a);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  paVar2 = &local_161;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_160,
             "target_link_libraries(${PROJECT_NAME}\n  INTERFACE\n    ComponentA\n    ComponentB\n    ComponentY\n    ComponentZ\n)\n\n"
             ,paVar2);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::__cxx11::ostringstream::ostringstream(local_2e0);
  RegenerateCmakeTargetLinkLibraries
            (in_stack_fffffffffffffc60,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffc58,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffc50,(bool)in_stack_fffffffffffffc4f);
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_308);
  local_2e1 = bVar1 & 1;
  if (local_2e1 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed: oss.str() == expectedOutput");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream(local_2e0);
  std::__cxx11::string::~string(local_160);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1577e6);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1577f3);
  return;
}

Assistant:

TEST(RegenerateCmakeTargetLinkLibraries_Interface) {
  bool isHeaderOnly = true;
  const std::set<std::string> publicDeps{
    "ComponentA",
    "ComponentB"
  };
  const std::set<std::string> privateDeps{
    "ComponentZ",
    "ComponentY"
  };

  const std::string expectedOutput(
      "target_link_libraries(${PROJECT_NAME}\n"
      "  INTERFACE\n"
      "    ComponentA\n"
      "    ComponentB\n"
      "    ComponentY\n"
      "    ComponentZ\n"
      ")\n"
      "\n");

  std::ostringstream oss;
  RegenerateCmakeTargetLinkLibraries(oss, publicDeps, privateDeps, isHeaderOnly);

  ASSERT(oss.str() == expectedOutput);
}